

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkreply.cpp
# Opt level: O2

void __thiscall QHttpNetworkReplyPrivate::removeAutoDecompressHeader(QHttpNetworkReplyPrivate *this)

{
  QHttpHeaderParser *this_00;
  qint64 qVar1;
  long in_FS_OFFSET;
  QByteArrayView name;
  QByteArrayView name_00;
  bool parseOk;
  char *pcStack_60;
  qsizetype local_58;
  QArrayDataPointer<char> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &(this->super_QHttpNetworkHeaderPrivate).parser;
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = &DAT_aaaaaaaaaaaaaaaa;
  _parseOk = (Data *)0x0;
  pcStack_60 = (char *)0x0;
  local_58 = 0;
  name_00.m_data = "content-length";
  name_00.m_size = 0xe;
  QHttpHeaderParser::firstHeaderField
            ((QByteArray *)&local_48,this_00,name_00,(QByteArray *)&parseOk);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&parseOk);
  _parseOk = (Data *)((ulong)_parseOk & 0xffffffffffffff00);
  qVar1 = QByteArray::toLongLong((bool *)&local_48,(int)&parseOk);
  if (parseOk == true) {
    this->removedContentLength = qVar1;
    name.m_data = "content-length";
    name.m_size = 0xe;
    QHttpHeaderParser::removeHeaderField(this_00,name);
  }
  QArrayDataPointer<char>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttpNetworkReplyPrivate::removeAutoDecompressHeader()
{
    // The header "Content-Encoding  = gzip" is retained.
    // Content-Length is removed since the actual one sent by the server is for compressed data
    constexpr auto name = QByteArrayView("content-length");
    QByteArray contentLength = parser.firstHeaderField(name);
    bool parseOk = false;
    qint64 value = contentLength.toLongLong(&parseOk);
    if (parseOk) {
        removedContentLength = value;
        parser.removeHeaderField(name);
    }
}